

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O2

String * asl::Directory::createTemp(void)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  String *in_RDI;
  ulong uVar4;
  double dVar5;
  double dVar6;
  String tmpDir;
  String local_90;
  File local_78;
  
  (in_RDI->field_2)._space[0] = '\0';
  in_RDI->_size = 0;
  in_RDI->_len = 0;
  dVar5 = now();
  String::String(&local_90,"/tmp");
  dVar6 = floor(dVar5 * 0.01);
  uVar4 = (ulong)((dVar5 * 0.01 - dVar6) * 2000000000.0);
  uVar2 = getpid();
  do {
    uVar3 = &local_90.field_2;
    if (local_90._size != 0) {
      uVar3 = local_90.field_2._str;
    }
    String::f((String *)&local_78,"%s/%04x%08x%08x",uVar3,(ulong)uVar2,(ulong)in_RDI & 0xffffffff,
              uVar4 & 0xffffffff);
    String::operator=(in_RDI,(String *)&local_78);
    String::~String((String *)&local_78);
    File::File(&local_78,in_RDI);
    bVar1 = File::exists(&local_78);
    File::~File(&local_78);
    uVar4 = (ulong)((int)uVar4 + 1);
  } while (bVar1);
  create(in_RDI);
  String::~String(&local_90);
  return in_RDI;
}

Assistant:

String Directory::createTemp()
{
	String dir;
	unsigned num = (unsigned)(2e9 * fract(0.01 * now()));
	unsigned p = (unsigned int)(size_t)&dir;
#ifdef _WIN32
	TCHAR tmpdir[MAX_PATH];
	DWORD ret = GetTempPath(MAX_PATH, tmpdir);
	String tmpDir = tmpdir;
	if (ret > MAX_PATH || ret == 0)
		return dir;
	unsigned pid = (unsigned int)GetCurrentProcessId();
#else
	String tmpDir = "/tmp";
	unsigned pid = (unsigned)getpid();
#endif
	do {
		dir = String::f("%s/%04x%08x%08x", *tmpDir, pid, p, num++);
	} while (File(dir).exists());
	create(dir);
	return dir;
}